

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O1

CentralDirectoryEntry *
find_file_in_zip(BYTE *dir,char *path,uint len,uint crc,short date,short time)

{
  ushort uVar1;
  int iVar2;
  size_t sVar3;
  CentralDirectoryEntry *pCVar4;
  CentralDirectoryEntry *unaff_RBX;
  bool bVar5;
  
  sVar3 = strlen(path);
  bVar5 = *(int *)dir == 0x2014b50;
  if (bVar5) {
    do {
      unaff_RBX = (CentralDirectoryEntry *)dir;
      uVar1 = unaff_RBX->NameLength;
      if (((uint)sVar3 == (uint)uVar1) &&
         (iVar2 = strncmp((char *)(unaff_RBX + 1),path,sVar3 & 0xffffffff), iVar2 == 0)) break;
      bVar5 = ((CentralDirectoryEntry *)
              (unaff_RBX[1].VersionMadeBy +
              (ulong)unaff_RBX->CommentLength + (ulong)unaff_RBX->ExtraLength + (ulong)uVar1 + -4))
              ->Magic == 0x2014b50;
      dir = unaff_RBX[1].VersionMadeBy +
            (ulong)unaff_RBX->CommentLength + (ulong)unaff_RBX->ExtraLength + (ulong)uVar1 + -4;
    } while (bVar5);
  }
  if ((((bVar5) && (unaff_RBX->CRC32 == crc)) && (unaff_RBX->UncompressedSize == len)) &&
     ((unaff_RBX->Flags & 1) == 0)) {
    pCVar4 = (CentralDirectoryEntry *)0x0;
    if (unaff_RBX->ExtraLength == 0) {
      pCVar4 = unaff_RBX;
    }
  }
  else {
    pCVar4 = (CentralDirectoryEntry *)0x0;
  }
  return pCVar4;
}

Assistant:

CentralDirectoryEntry *find_file_in_zip(BYTE *dir, const char *path, unsigned int len, unsigned int crc, short date, short time)
{
	int pathlen = (int)strlen(path);
	CentralDirectoryEntry *ent;
	int flags;

	while (memcmp(dir, (const BYTE *)&centralfile, sizeof(UINT32)) == 0)
	{
		ent = (CentralDirectoryEntry *)dir;
		if (pathlen == LittleShort(ent->NameLength) &&
			strncmp((char *)(ent + 1), path, pathlen) == 0)
		{
			// Found something that matches by name.
			break;
		}
		dir += sizeof(*ent) + LittleShort(ent->NameLength) + LittleShort(ent->ExtraLength) + LittleShort(ent->CommentLength);
	}
	if (memcmp(dir, (const BYTE *)&centralfile, sizeof(UINT32)) != 0)
	{
		return NULL;
	}
	if (crc != LittleLong(ent->CRC32))
	{
		return NULL;
	}
	if (len != LittleLong(ent->UncompressedSize))
	{
		return NULL;
	}
	// Should I check modification date and time here?
	flags = LittleShort(ent->Flags);
	if (flags & 1)
	{ // Don't want to deal with encryption.
		return NULL;
	}
	if (ent->ExtraLength != 0)
	{ // Don't want to deal with extra data.
		return NULL;
	}
	// Okay, looks good.
	return ent;
}